

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake3_avx2.c
# Opt level: O0

void blake3_hash_many_avx2
               (uint8_t **inputs,size_t num_inputs,size_t blocks,uint32_t *key,uint64_t counter,
               _Bool increment_counter,uint8_t flags,uint8_t flags_start,uint8_t flags_end,
               uint8_t *out)

{
  byte bVar1;
  size_t in_RCX;
  uint8_t **in_RDX;
  ulong in_RSI;
  size_t in_R8;
  byte in_R9B;
  uint8_t in_stack_00000018;
  undefined7 in_stack_00000020;
  uint8_t in_stack_00000050;
  uint8_t in_stack_00000058;
  undefined7 in_stack_00000069;
  uint8_t in_stack_000005c6;
  undefined1 in_stack_000005c7;
  uint64_t in_stack_000005c8;
  uint32_t *in_stack_000005d0;
  size_t in_stack_000005d8;
  uint8_t **in_stack_000005e0;
  uint64_t in_stack_ffffffffffffffb8;
  uint8_t *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  undefined8 local_18;
  
  bVar1 = in_R9B & 1;
  for (local_18 = in_RSI; 7 < local_18; local_18 = local_18 - 8) {
    in_stack_ffffffffffffffb8 = _in_stack_00000020;
    blake3_hash8_avx2(in_stack_000005e0,in_stack_000005d8,in_stack_000005d0,in_stack_000005c8,
                      (_Bool)in_stack_000005c7,in_stack_000005c6,in_stack_00000018,
                      (uint8_t)_in_stack_00000020,in_stack_ffffffffffffffc0);
    if ((bVar1 & 1) != 0) {
      in_R8 = in_R8 + 8;
    }
    _in_stack_00000020 = _in_stack_00000020 + 0x100;
  }
  blake3_hash_many_sse41
            (in_RDX,in_RCX,in_R8,(uint32_t *)CONCAT17(bVar1,in_stack_ffffffffffffffc8),
             _in_stack_00000020,SUB81(in_stack_ffffffffffffffb8 >> 0x38,0),in_stack_00000050,
             in_stack_00000058,flags,(uint8_t *)CONCAT71(in_stack_00000069,flags_start));
  return;
}

Assistant:

void blake3_hash_many_avx2(const uint8_t *const *inputs, size_t num_inputs,
                           size_t blocks, const uint32_t key[8],
                           uint64_t counter, bool increment_counter,
                           uint8_t flags, uint8_t flags_start,
                           uint8_t flags_end, uint8_t *out) {
  while (num_inputs >= DEGREE) {
    blake3_hash8_avx2(inputs, blocks, key, counter, increment_counter, flags,
                      flags_start, flags_end, out);
    if (increment_counter) {
      counter += DEGREE;
    }
    inputs += DEGREE;
    num_inputs -= DEGREE;
    out = &out[DEGREE * BLAKE3_OUT_LEN];
  }
#if !defined(BLAKE3_NO_SSE41)
  blake3_hash_many_sse41(inputs, num_inputs, blocks, key, counter,
                         increment_counter, flags, flags_start, flags_end, out);
#else
  blake3_hash_many_portable(inputs, num_inputs, blocks, key, counter,
                            increment_counter, flags, flags_start, flags_end,
                            out);
#endif
}